

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration_proxy.hpp
# Opt level: O1

string_type * __thiscall
nlohmann::detail::
iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::key(iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      *this)

{
  value_t vVar1;
  pointer pbVar2;
  key_type *pkVar3;
  string_type *psVar4;
  
  pbVar2 = (this->anchor).m_object;
  if (pbVar2 == (pointer)0x0) {
    __assert_fail("anchor.m_object != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PepcyCh[P]vga-debugger-generator/build_O1/_deps/nlohmann_json-src/include/nlohmann/detail/iterators/iteration_proxy.hpp"
                  ,0x4d,
                  "const string_type &nlohmann::detail::iteration_proxy_value<nlohmann::detail::iter_impl<const nlohmann::basic_json<>>>::key() const [IteratorType = nlohmann::detail::iter_impl<const nlohmann::basic_json<>>]"
                 );
  }
  vVar1 = pbVar2->m_type;
  if (vVar1 != object) {
    if (vVar1 == array) {
      if (this->array_index != this->array_index_last) {
        int_to_string<std::__cxx11::string>(&this->array_index_str,this->array_index);
        this->array_index_last = this->array_index;
      }
      psVar4 = &this->array_index_str;
    }
    else {
      psVar4 = &this->empty_str;
    }
    return psVar4;
  }
  pkVar3 = iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::key(&this->anchor);
  return pkVar3;
}

Assistant:

const string_type& key() const
    {
        JSON_ASSERT(anchor.m_object != nullptr);

        switch (anchor.m_object->type())
        {
            // use integer array index as key
            case value_t::array:
            {
                if (array_index != array_index_last)
                {
                    int_to_string( array_index_str, array_index );
                    array_index_last = array_index;
                }
                return array_index_str;
            }

            // use key from the object
            case value_t::object:
                return anchor.key();

            // use an empty key for all primitive types
            default:
                return empty_str;
        }
    }